

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guid_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::GUIDTest_test_guid_string_is_hex_Test::TestBody
          (GUIDTest_test_guid_string_is_hex_Test *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  char *in_R9;
  bool local_e9;
  bool local_c9;
  string local_a0;
  AssertHelper local_80;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  int i;
  string local_48 [8];
  string string_val;
  GUID guid;
  int local_14;
  int it;
  GUIDTest_test_guid_string_is_hex_Test *this_local;
  
  local_14 = 0;
  do {
    if (999 < local_14) {
      return;
    }
    bidfx_public_api::tools::GUID::GUID((GUID *)(string_val.field_2._M_local_buf + 8));
    bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
    for (gtest_ar_.message_.ptr_._0_4_ = 0; uVar2 = (ulong)(int)gtest_ar_.message_.ptr_,
        uVar3 = std::__cxx11::string::size(), uVar2 < uVar3;
        gtest_ar_.message_.ptr_._0_4_ = (int)gtest_ar_.message_.ptr_ + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
      if (*pcVar4 < '0') {
LAB_002b66c9:
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
        if ('@' < *pcVar4) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
          local_c9 = true;
          if (*pcVar4 < 'G') goto LAB_002b6780;
        }
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
        local_e9 = false;
        if ('`' < *pcVar4) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
          local_e9 = *pcVar4 < 'g';
        }
        local_c9 = local_e9;
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
        local_c9 = true;
        if ('9' < *pcVar4) goto LAB_002b66c9;
      }
LAB_002b6780:
      local_69 = local_c9;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_68,&local_69,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
      if (!bVar1) {
        testing::Message::Message(&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_a0,(internal *)local_68,
                   (AssertionResult *)
                   "string_val[i] >= \'0\' && string_val[i] <= \'9\' || string_val[i] >= \'A\' && string_val[i] <= \'F\' || string_val[i] >= \'a\' && string_val[i] <= \'f\'"
                   ,"false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                   ,0x33,pcVar4);
        testing::internal::AssertHelper::operator=(&local_80,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        testing::Message::~Message(&local_78);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
      if (bVar1) goto LAB_002b6915;
    }
    bVar1 = false;
LAB_002b6915:
    std::__cxx11::string::~string(local_48);
    bidfx_public_api::tools::GUID::~GUID((GUID *)(string_val.field_2._M_local_buf + 8));
    if (bVar1) {
      return;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

TEST_F(GUIDTest, test_guid_string_is_hex)
{
    for (int it = 0; it < 1000; it++)
    {
        GUID guid;
        std::string string_val = guid.ToString();
        for (int i = 0; i < string_val.size(); i++)
        {
            ASSERT_TRUE(string_val[i] >= '0' && string_val[i] <= '9' ||
                        string_val[i] >= 'A' && string_val[i] <= 'F' ||
                        string_val[i] >= 'a' && string_val[i] <= 'f');
        }
    }
}